

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O0

void __thiscall Texture::Texture(Texture *this,char *img)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  bool bVar3;
  ulong uVar4;
  void *pvVar5;
  stbi_uc *psVar6;
  ostream *poVar7;
  char *in_RSI;
  undefined4 *in_RDI;
  float fVar8;
  int g;
  int w;
  float s;
  int k;
  int j;
  int i;
  bool ret;
  HDRLoaderResult result;
  string img_;
  HDRLoaderResult *in_stack_00000180;
  char *in_stack_00000188;
  char *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  int req_comp;
  int *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  int local_94;
  int local_90;
  float local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_78;
  int local_74;
  long local_70;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  char *local_10;
  
  req_comp = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  *in_RDI = 2;
  local_10 = in_RSI;
  Vector3f::Vector3f((Vector3f *)(in_RDI + 4),0.0);
  std::function<Vector2f_(Vector2f)>::function
            ((function<Vector2f_(Vector2f)> *)in_stack_fffffffffffffef0);
  pcVar2 = local_10;
  *(undefined1 *)(in_RDI + 0x18) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar2,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_68,(ulong)local_30);
  bVar3 = std::operator==(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::__cxx11::string::~string(local_68);
  if (bVar3) {
    *(undefined8 *)(in_RDI + 0x14) = 0;
    bVar3 = HDRLoader::load(in_stack_00000188,in_stack_00000180);
    if (!bVar3) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/texture.h"
                    ,0x22,"Texture::Texture(const char *)");
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)((((local_78 / 2) * local_74) / 2) * 3);
    uVar4 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4);
    *(void **)(in_RDI + 0x16) = pvVar5;
    in_RDI[0x10] = local_78 / 2;
    in_RDI[0x11] = local_74 / 2;
    in_RDI[0x12] = 3;
    for (local_80 = 0; local_80 < (int)in_RDI[0x10]; local_80 = local_80 + 1) {
      for (local_84 = 0; local_84 < (int)in_RDI[0x11]; local_84 = local_84 + 1) {
        for (local_88 = 0; local_88 < 3; local_88 = local_88 + 1) {
          local_8c = 0.0;
          for (local_90 = 0; local_90 < 2; local_90 = local_90 + 1) {
            for (local_94 = 0; local_94 < 2; local_94 = local_94 + 1) {
              local_8c = *(float *)(local_70 +
                                   (long)((local_80 * 2 + local_90) * local_74 * 3 +
                                          (local_84 * 2 + local_94) * 3 + local_88) * 4) + local_8c;
            }
          }
          fVar8 = powf(local_8c / 4.0,0.1);
          *(float *)(*(long *)(in_RDI + 0x16) +
                    (long)(local_80 * in_RDI[0x11] * 3 + local_84 * 3 + local_88) * 4) = fVar8;
        }
      }
    }
  }
  else {
    *(undefined8 *)(in_RDI + 0x16) = 0;
    psVar6 = stbi_load(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08
                       ,in_stack_ffffffffffffff00,req_comp);
    *(stbi_uc **)(in_RDI + 0x14) = psVar6;
  }
  poVar7 = std::operator<<((ostream *)&std::cerr,"loaded image ");
  poVar7 = std::operator<<(poVar7,local_10);
  poVar7 = std::operator<<(poVar7,": ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_RDI[0x10]);
  poVar7 = std::operator<<(poVar7,"x");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_RDI[0x11]);
  poVar7 = std::operator<<(poVar7,"x");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_RDI[0x12]);
  std::operator<<(poVar7,"\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

Texture(const char* img) :type(TEXTURE_RECT)
	{
		std::string img_ = img;
		if (img_.substr(img_.size() - 4) == ".hdr") {
			image_buff_stbi = nullptr;
			HDRLoaderResult result;
			bool ret = HDRLoader::load(img, result);
			assert(ret);
			hdr_buff = new float[result.width / 2 * result.height / 2 * 3];
			image_w = result.width/2;
			image_h = result.height/2;
			image_c = 3;
			for(int i=0;i<image_w;++i)
				for(int j=0;j<image_h;++j)
					for (int k = 0; k < 3; ++k)
					{
						float s = 0;
						for (int w = 0; w < 2; ++w)
							for (int g = 0; g < 2; ++g)
								s += result.cols[(i * 2 + w) * result.height * 3 + (j * 2 + g) * 3 + k];
						hdr_buff[i * image_h * 3 + j * 3 + k] = powf(s / 4, 0.1);
					}
		}
		else {
			hdr_buff = nullptr;
			image_buff_stbi = stbi_load(img, &image_w, &image_h, &image_c, 0);
		}
		std::cerr << "loaded image " << img << ": " << image_w << "x" << image_h << "x" << image_c << "\n";
	}